

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O3

void reduce_relational_op(List *list)

{
  TokenType TVar1;
  List *ls;
  ListStruct *pLVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  BOOL BVar6;
  char *pcVar7;
  bool bVar8;
  
  ls = list->car;
  iVar5 = list_length(ls);
  if (iVar5 != 3) {
    parse_error(ls,"Incorrect number of arguments to %s operator.\n",(ls->token).u.string);
    return;
  }
  pLVar2 = ls->cdr;
  TVar1 = (pLVar2->token).type;
  if ((TVar1 - TOK_IDENTIFIER < 3) && (TVar1 == (pLVar2->cdr->token).type)) {
    BVar6 = tokens_equal(&pLVar2->token,&pLVar2->cdr->token);
    TVar1 = (ls->token).type;
    if (TVar1 != TOK_EQUAL) {
      if (TVar1 == TOK_NOT_EQUAL) {
        BVar6 = (BOOL)(BVar6 == FALSE);
      }
      else {
        pLVar2 = ls->cdr;
        if ((pLVar2->token).type != TOK_NUMBER) {
          return;
        }
        if ((pLVar2->cdr->token).type != TOK_NUMBER) {
          return;
        }
        if (TVar1 - TOK_GREATER_THAN < 4) {
          lVar3 = (pLVar2->token).u.n;
          lVar4 = (pLVar2->cdr->token).u.n;
          switch(TVar1) {
          case TOK_GREATER_THAN:
            bVar8 = lVar4 < lVar3;
            break;
          case TOK_LESS_THAN:
            bVar8 = lVar3 < lVar4;
            break;
          case TOK_GREATER_OR_EQUAL:
            bVar8 = lVar4 <= lVar3;
            break;
          case TOK_LESS_OR_EQUAL:
            bVar8 = lVar3 <= lVar4;
          }
        }
        else {
          bVar8 = false;
          fatal_parse_error(ls,
                            "reduce.c internal error: non-relational op passed to reduce_relational_op().\n"
                           );
        }
        BVar6 = (BOOL)bVar8;
      }
    }
    list->car = (ListStruct *)0x0;
    (list->token).type = (uint)(BVar6 != FALSE);
    pcVar7 = "false";
    if (BVar6 != FALSE) {
      pcVar7 = "true";
    }
    (list->token).u.string = pcVar7;
  }
  return;
}

Assistant:

static void
reduce_relational_op (List *list)
{
  BOOL equal, val;
  List *ls = list->car;

  /* Make sure there are the right # of args. */
  if (list_length (ls) != 3)
    {
      parse_error (ls, "Incorrect number of arguments to %s operator.\n",
		   ls->token.u.string);
      return;
    }
  
  /* Make sure we are comparing two things of equal and appropriate types. */
  if (ls->cdr->token.type != (CDDR (ls))->token.type
      || (ls->cdr->token.type != TOK_NUMBER
	  && ls->cdr->token.type != TOK_IDENTIFIER
	  && ls->cdr->token.type != TOK_QUOTED_STRING))
    return;

  /* Are the two tokens equal? */
  equal = tokens_equal (&ls->cdr->token, &CDDR(ls)->token);

  /* See if we need to do a numeric or an arbitrary comparison. */
  if (ls->token.type == TOK_EQUAL)
    val = equal;
  else if (ls->token.type == TOK_NOT_EQUAL)
    val = !equal;
  else  /* It's a numerical comparison. */
    {
      long n1, n2;

      if (ls->cdr->token.type != TOK_NUMBER
	  || CDDR(ls)->token.type != TOK_NUMBER)
	{
	  return;
	}

      /* Fetch the two numbers to be compared. */
      n1 = ls->cdr->token.u.n;
      n2 = CDDR(ls)->token.u.n;

      switch (ls->token.type) {
      case TOK_GREATER_THAN:
	val = (n1 > n2);
	break;
      case TOK_LESS_THAN:
	val = (n1 < n2);
	break;
      case TOK_GREATER_OR_EQUAL:
	val = (n1 >= n2);
	break;
      case TOK_LESS_OR_EQUAL:
	val = (n1 <= n2);
	break;
      default:
	val = FALSE;
	fatal_parse_error (ls, "reduce.c internal error: non-relational op "
			   "passed to reduce_relational_op().\n");
	break;
      }
    }

  set_list_to_boolean (list, val ? TOK_TRUE : TOK_FALSE);
}